

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

int float128_unordered_quiet_mips64(float128 a,float128 b,float_status *status)

{
  int iVar1;
  int iVar2;
  
  if ((((~a.high & 0x7fff000000000000) == 0) &&
      (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
       a.low != 0)) ||
     ((iVar2 = 0, (~b.high & 0x7fff000000000000) == 0 &&
      (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
       b.low != 0)))) {
    iVar1 = float128_is_signaling_nan_mips64(a,status);
    iVar2 = 1;
    if ((iVar1 == 0) && (iVar1 = float128_is_signaling_nan_mips64(b,status), iVar1 == 0)) {
      return 1;
    }
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  return iVar2;
}

Assistant:

int float128_unordered_quiet(float128 a, float128 b, float_status *status)
{
    if (    (    ( extractFloat128Exp( a ) == 0x7FFF )
              && ( extractFloat128Frac0( a ) | extractFloat128Frac1( a ) ) )
         || (    ( extractFloat128Exp( b ) == 0x7FFF )
              && ( extractFloat128Frac0( b ) | extractFloat128Frac1( b ) ) )
       ) {
        if (float128_is_signaling_nan(a, status)
         || float128_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 1;
    }
    return 0;
}